

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frobtadsapp.cc
# Opt level: O2

void __thiscall
FrobTadsApplication::FrobTadsApplication(FrobTadsApplication *this,FrobOptions *opts)

{
  this->_vptr_FrobTadsApplication = (_func_int **)&PTR___cxa_pure_virtual_00341be0;
  FrobOptions::FrobOptions(&this->options,opts);
  this->fRemainingTimeout = 0;
  this->fColorsEnabled = false;
  globalApp = this;
  signal(0x1c,winResizeHandler);
  return;
}

Assistant:

FrobTadsApplication::FrobTadsApplication( const FrobOptions& opts )
: options(opts), fRemainingTimeout(0), fColorsEnabled(false)
{
    // Initialize the global pointer to us.
    globalApp = this;

    // Install our window-resize signal handler.
#if HAVE_SIGWINCH
    signal(SIGWINCH, winResizeHandler);
#endif
}